

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void __thiscall TCMallocImplementation::MarkThreadBusy(TCMallocImplementation *this)

{
  PageID this_00;
  bool bVar1;
  int32_t iVar2;
  SizeMap *this_01;
  ThreadCache *pTVar3;
  PageHeap *pPVar4;
  ulong uVar5;
  size_t sVar6;
  CentralFreeList *pCVar7;
  ThreadCachePtr TVar8;
  bool local_1d1;
  TCMallocImplementation *this_local;
  size_t allocated_size;
  ThreadCache *pTStack_198;
  uint32_t cl;
  undefined1 local_190;
  undefined1 local_188 [8];
  ThreadCachePtr cache_ptr;
  void *local_170;
  uint local_164;
  long lStack_160;
  uint32_t idx;
  bool local_158;
  undefined7 uStack_157;
  SizeMap *local_150;
  undefined1 local_141;
  Span *local_140;
  Span *span;
  bool cache_hit;
  ulong uStack_130;
  uint32_t cl_1;
  PageID p;
  ThreadCache *heap;
  byte local_111;
  _func_void_void_ptr *local_110;
  void *local_108;
  uint local_fc;
  long lStack_f8;
  uint32_t idx_1;
  ThreadCache *local_f0;
  SizeMap *local_e8;
  undefined1 local_d9;
  uint *local_d8;
  ThreadCache *local_d0;
  char local_c1;
  uint *local_c0;
  bool local_b8;
  undefined7 uStack_b7;
  char local_a9;
  ulong local_a8;
  PageHeap *local_a0;
  ulong local_98;
  Number i2;
  Number i1;
  PageMap *local_80;
  Span *local_78;
  void *local_70;
  void *local_68;
  void *rv;
  FreeList *list;
  uint local_4c;
  size_t local_48;
  ThreadCache *local_40;
  void *local_38;
  uint32_t local_2c;
  FreeList *pFStack_28;
  uint32_t length;
  FreeList *list_1;
  void *local_18;
  PageID local_10;
  
  cache_ptr.is_emergency_malloc_ = false;
  cache_ptr._9_7_ = 0;
  TVar8 = tcmalloc::ThreadCachePtr::Grab();
  pTStack_198 = TVar8.ptr_;
  local_190 = TVar8.is_emergency_malloc_;
  local_188 = (undefined1  [8])pTStack_198;
  cache_ptr.ptr_._0_1_ = local_190;
  bVar1 = tcmalloc::ThreadCachePtr::IsEmergencyMallocEnabled((ThreadCachePtr *)local_188);
  if (bVar1) {
    local_170 = tcmalloc::EmergencyMalloc(cache_ptr._8_8_);
  }
  else {
    local_150 = tcmalloc::Static::sizemap();
    local_158 = cache_ptr.is_emergency_malloc_;
    uStack_157 = cache_ptr._9_7_;
    lStack_160 = (long)&allocated_size + 4;
    local_b8 = cache_ptr.is_emergency_malloc_;
    uStack_b7 = cache_ptr._9_7_;
    local_c0 = &local_164;
    if ((ulong)cache_ptr._8_8_ < 0x401) {
      local_164 = cache_ptr._8_4_ + 7U >> 3;
      local_a9 = '\x01';
    }
    else if ((ulong)cache_ptr._8_8_ < 0x40001) {
      local_164 = cache_ptr._8_4_ + 0x3c7fU >> 7;
      local_a9 = '\x01';
    }
    else {
      local_a9 = '\0';
    }
    local_141 = local_a9 != '\0';
    if ((bool)local_141) {
      allocated_size._4_4_ = (uint)local_150->class_array_[local_164];
      this_01 = tcmalloc::Static::sizemap();
      iVar2 = tcmalloc::SizeMap::class_to_size(this_01,allocated_size._4_4_);
      pTVar3 = tcmalloc::ThreadCachePtr::operator->((ThreadCachePtr *)local_188);
      bVar1 = tcmalloc::ThreadCache::SampleAllocation(pTVar3,(long)iVar2);
      if (bVar1) {
        local_170 = DoSampledAllocation(cache_ptr._8_8_);
      }
      else {
        pTVar3 = tcmalloc::ThreadCachePtr::operator->((ThreadCachePtr *)local_188);
        local_4c = allocated_size._4_4_;
        list = (FreeList *)anon_unknown.dwarf_104c2::nop_oom_handler;
        rv = pTVar3->list_ + allocated_size._4_4_;
        local_48 = (long)iVar2;
        local_40 = pTVar3;
        iVar2 = tcmalloc::ThreadCache::FreeList::object_size((FreeList *)rv);
        local_48 = (size_t)iVar2;
        bVar1 = tcmalloc::ThreadCache::FreeList::TryPop((FreeList *)rv,&local_68);
        if (bVar1) {
          pTVar3->size_ = pTVar3->size_ - (int32_t)local_48;
          local_38 = local_68;
        }
        else {
          local_38 = tcmalloc::ThreadCache::FetchFromCentralCache
                               (pTVar3,local_4c,(int32_t)local_48,(_func_void_ptr_size_t *)list);
        }
        local_70 = local_38;
        local_170 = local_38;
      }
    }
    else {
      pTVar3 = tcmalloc::ThreadCachePtr::get((ThreadCachePtr *)local_188);
      local_170 = anon_unknown.dwarf_104c2::do_malloc_pages(pTVar3,cache_ptr._8_8_);
    }
  }
  local_108 = local_170;
  local_110 = anon_unknown.dwarf_104c2::InvalidFree;
  local_111 = 0;
  heap = (ThreadCache *)0x0;
  p = (PageID)tcmalloc::ThreadCachePtr::GetIfPresent();
  uStack_130 = (ulong)local_108 >> 0xd;
  if ((local_111 & 1) != 0) {
    local_e8 = tcmalloc::Static::sizemap();
    local_f0 = heap;
    lStack_f8 = (long)&span + 4;
    local_d0 = heap;
    local_d8 = &local_fc;
    if (heap < (ThreadCache *)0x401) {
      local_fc = (int)heap + 7U >> 3;
      local_c1 = '\x01';
    }
    else if (heap < (ThreadCache *)0x40001) {
      local_fc = (int)heap + 0x3c7fU >> 7;
      local_c1 = '\x01';
    }
    else {
      local_c1 = '\0';
    }
    local_d9 = local_c1 != '\0';
    if ((bool)local_d9) {
      span._4_4_ = (uint)local_e8->class_array_[local_fc];
      goto LAB_00119146;
    }
  }
  local_1d1 = false;
  if ((local_111 & 1) == 0) {
    pPVar4 = tcmalloc::Static::pageheap();
    local_1d1 = tcmalloc::PageHeap::TryGetSizeClass(pPVar4,uStack_130,(uint32_t *)((long)&span + 4))
    ;
  }
  span._3_1_ = local_1d1;
  if (((local_1d1 ^ 0xffU) & 1) != 0) {
    local_a0 = tcmalloc::Static::pageheap();
    local_a8 = uStack_130;
    local_80 = &local_a0->pagemap_;
    i1 = uStack_130;
    i2 = uStack_130 >> 0x12;
    local_98 = uStack_130 & 0x3ffff;
    if ((uStack_130 >> 0x23 == 0) && (local_80->root_[i2] != (Leaf *)0x0)) {
      local_78 = (Span *)local_80->root_[i2]->values[local_98];
    }
    else {
      local_78 = (Span *)0x0;
    }
    local_140 = local_78;
    if (local_78 == (Span *)0x0) {
      anon_unknown.dwarf_104c2::free_null_or_invalid(local_108,local_110);
      return;
    }
    span._4_4_ = *(uint *)&local_78->field_0x28 >> 0x10 & 0xff;
    if (span._4_4_ == 0) {
      anon_unknown.dwarf_104c2::do_free_pages(local_78,local_108);
      return;
    }
    if ((local_111 & 1) == 0) {
      pPVar4 = tcmalloc::Static::pageheap();
      tcmalloc::PageHeap::SetCachedSizeClass(pPVar4,uStack_130,span._4_4_);
    }
  }
LAB_00119146:
  this_00 = p;
  if (p == 0) {
    bVar1 = tcmalloc::Static::IsInited();
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcmalloc::SLL_SetNext(local_108,(void *)0x0);
      pCVar7 = tcmalloc::Static::central_cache();
      tcmalloc::CentralFreeList::InsertRange(pCVar7 + span._4_4_,local_108,local_108,1);
    }
    else {
      anon_unknown.dwarf_104c2::free_null_or_invalid(local_108,local_110);
    }
  }
  else {
    local_10 = p;
    local_18 = local_108;
    list_1._4_4_ = span._4_4_;
    pFStack_28 = (FreeList *)(p + (ulong)span._4_4_ * 0x20);
    local_2c = tcmalloc::ThreadCache::FreeList::Push(pFStack_28,local_108);
    uVar5 = (ulong)local_2c;
    sVar6 = tcmalloc::ThreadCache::FreeList::max_length(pFStack_28);
    if (sVar6 < uVar5) {
      tcmalloc::ThreadCache::ListTooLong((ThreadCache *)this_00,pFStack_28,list_1._4_4_);
    }
    else {
      iVar2 = tcmalloc::ThreadCache::FreeList::object_size(pFStack_28);
      *(int32_t *)(this_00 + 0x1000) = iVar2 + *(int *)(this_00 + 0x1000);
      if (*(int *)(this_00 + 0x1004) < *(int *)(this_00 + 0x1000)) {
        tcmalloc::ThreadCache::Scavenge((ThreadCache *)this_00);
      }
    }
  }
  return;
}

Assistant:

void TCMallocImplementation::MarkThreadBusy() {
  // Allocate to force the creation of a thread cache, but avoid
  // invoking any hooks.
  do_free(do_malloc(0));
}